

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

void spdlog::throw_spdlog_ex(string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  spdlog_ex *this;
  string local_40;
  
  this = (spdlog_ex *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&msg->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  spdlog_ex::spdlog_ex(this,&local_40);
  __cxa_throw(this,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void throw_spdlog_ex(std::string msg)
{
    SPDLOG_THROW(spdlog_ex(std::move(msg)));
}